

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

void xfer_setup(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,int writesockindex,
               _Bool shutdown)

{
  connectdata *pcVar1;
  _Bool _Var2;
  curl_socket_t local_54;
  curl_socket_t local_50;
  curl_socket_t local_4c;
  curl_socket_t local_48;
  _Bool want_send;
  connectdata *conn;
  SingleRequest *k;
  int local_28;
  _Bool shutdown_local;
  int writesockindex_local;
  _Bool getheader_local;
  curl_off_t size_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  _Var2 = Curl_req_want_send(data);
  local_28 = writesockindex;
  if (((((ulong)pcVar1->bits >> 0x16 & 1) != 0) || (0x13 < pcVar1->httpversion)) || (_Var2)) {
    if (sockindex == -1) {
      if (writesockindex == -1) {
        local_48 = -1;
      }
      else {
        local_48 = pcVar1->sock[writesockindex];
      }
      local_4c = local_48;
    }
    else {
      local_4c = pcVar1->sock[sockindex];
    }
    pcVar1->sockfd = local_4c;
    pcVar1->writesockfd = pcVar1->sockfd;
    if (_Var2) {
      local_28 = 0;
    }
  }
  else {
    if (sockindex == -1) {
      local_50 = -1;
    }
    else {
      local_50 = pcVar1->sock[sockindex];
    }
    pcVar1->sockfd = local_50;
    if (writesockindex == -1) {
      local_54 = -1;
    }
    else {
      local_54 = pcVar1->sock[writesockindex];
    }
    pcVar1->writesockfd = local_54;
  }
  *(uint *)&(data->req).field_0xd9 =
       *(uint *)&(data->req).field_0xd9 & 0xfffeffff | (uint)getheader << 0x10;
  (data->req).size = size;
  *(uint *)&(data->req).field_0xd9 =
       *(uint *)&(data->req).field_0xd9 & 0xffefffff | (uint)shutdown << 0x14;
  if (((*(uint *)&(data->req).field_0xd9 >> 0x10 & 1) == 0) &&
     (*(uint *)&(data->req).field_0xd9 = *(uint *)&(data->req).field_0xd9 & 0xfffffffe, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if (((*(uint *)&(data->req).field_0xd9 >> 0x10 & 1) != 0) ||
     ((*(uint *)&(data->req).field_0xd9 >> 0x11 & 1) == 0)) {
    if (sockindex != -1) {
      (data->req).keepon = (data->req).keepon | 1;
    }
    if (local_28 != -1) {
      (data->req).keepon = (data->req).keepon | 2;
    }
  }
  return;
}

Assistant:

static void xfer_setup(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex,       /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  bool shutdown             /* shutdown connection at transfer end. Only
                             * supported when sending OR receiving. */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  bool want_send = Curl_req_want_send(data);

  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));
  DEBUGASSERT((writesockindex <= 1) && (writesockindex >= -1));
  DEBUGASSERT(!shutdown || (sockindex == -1) || (writesockindex == -1));

  if(conn->bits.multiplex || conn->httpversion >= 20 || want_send) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
    if(want_send)
      /* special and very HTTP-specific */
      writesockindex = FIRSTSOCKET;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }

  k->getheader = getheader;
  k->size = size;
  k->shutdown = shutdown;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then do not do this! */
  if(k->getheader || !data->req.no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1)
      k->keepon |= KEEP_SEND;
  } /* if(k->getheader || !data->req.no_body) */

}